

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeBee.cpp
# Opt level: O2

int TeeBee::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  Data *data;
  int iVar1;
  
  data = (Data *)UnityAudioEffectState::GetEffectData<TeeBee::EffectData>(state);
  if (index < 0x11) {
    data->p[index] = value;
    iVar1 = 0;
    if ((uint)index < 3) {
      CalcPattern(data);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        if (index == P_SEED || index == P_MINNOTE || index == P_MAXNOTE)
            CalcPattern(data);
        return UNITY_AUDIODSP_OK;
    }